

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::truncF64x2(Literal *__return_storage_ptr__,Literal *this)

{
  long lVar1;
  Literal *this_00;
  double extraout_XMM0_Qa;
  double __x;
  double extraout_XMM0_Qa_00;
  Literal local_70;
  undefined1 local_58 [8];
  LaneArray<2> lanes;
  
  getLanesF64x2((LaneArray<2> *)local_58,this);
  __x = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0x18) {
    this_00 = (Literal *)(local_58 + lVar1);
    trunc(&local_70,__x);
    if (this_00 != &local_70) {
      ~Literal(this_00);
      Literal(this_00,&local_70);
    }
    ~Literal(&local_70);
    __x = extraout_XMM0_Qa_00;
  }
  Literal(__return_storage_ptr__,(LaneArray<2> *)local_58);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncF64x2() const {
  return unary<2, &Literal::getLanesF64x2, &Literal::trunc>(*this);
}